

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_marshal_mod3(uint8_t *out,poly *in)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint16_t coeffs4;
  uint16_t coeffs3;
  uint16_t coeffs2;
  uint16_t coeffs1;
  uint16_t coeffs0;
  size_t i;
  uint16_t *coeffs;
  poly *in_local;
  uint8_t *out_local;
  
  if ((in->field_0).v[700] == 0) {
    i = (size_t)in;
    for (_coeffs3 = 0; _coeffs3 < 0x8c; _coeffs3 = _coeffs3 + 1) {
      uVar1 = mod3_from_modQ(*(uint16_t *)i);
      uVar2 = mod3_from_modQ(*(uint16_t *)(i + 2));
      uVar3 = mod3_from_modQ(*(uint16_t *)(i + 4));
      uVar4 = mod3_from_modQ(*(uint16_t *)(i + 6));
      uVar5 = mod3_from_modQ(*(uint16_t *)(i + 8));
      out[_coeffs3] =
           (char)uVar1 + (char)uVar2 * '\x03' + (char)uVar3 * '\t' + (char)uVar4 * '\x1b' +
           (char)uVar5 * 'Q';
      i = i + 10;
    }
    return;
  }
  __assert_fail("coeffs[N - 1] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                ,0x681,"void poly_marshal_mod3(uint8_t *, const struct poly *)");
}

Assistant:

static void poly_marshal_mod3(uint8_t out[HRSS_POLY3_BYTES],
                              const struct poly *in) {
  const uint16_t *coeffs = in->v;

  // Only 700 coefficients are marshaled because in[700] must be zero.
  assert(coeffs[N - 1] == 0);

  for (size_t i = 0; i < HRSS_POLY3_BYTES; i++) {
    const uint16_t coeffs0 = mod3_from_modQ(coeffs[0]);
    const uint16_t coeffs1 = mod3_from_modQ(coeffs[1]);
    const uint16_t coeffs2 = mod3_from_modQ(coeffs[2]);
    const uint16_t coeffs3 = mod3_from_modQ(coeffs[3]);
    const uint16_t coeffs4 = mod3_from_modQ(coeffs[4]);
    out[i] = coeffs0 + coeffs1 * 3 + coeffs2 * 9 + coeffs3 * 27 + coeffs4 * 81;
    coeffs += 5;
  }
}